

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GLSL420Pack::GLSLTestBase::checkResults(GLSLTestBase *this,texture *color_texture)

{
  int iVar1;
  reference pvVar2;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar3;
  _Setw local_1dc;
  _Setfill<char> local_1d5;
  _Setbase local_1d4;
  MessageBuilder local_1d0;
  uint local_50 [2];
  GLuint i;
  undefined1 local_40 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> texture_data;
  GLuint texture_data_size;
  texture *color_texture_local;
  GLSLTestBase *this_local;
  
  texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0x100;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,0x100);
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,0);
  Utils::texture::get(color_texture,0x1908,0x1401,pvVar2);
  local_50[0] = 0;
  do {
    if (0xff < local_50[0]) {
      iVar1 = (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
                [0xe])();
      this_local._7_1_ = (bool)((byte)iVar1 & 1);
LAB_010abed2:
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
      return this_local._7_1_;
    }
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,
                        (ulong)local_50[0]);
    if (*pvVar2 != 0xff00ff00) {
      this_00 = deqp::Context::getTestContext((this->super_TestBase).super_TestCase.m_context);
      this_01 = tcu::TestContext::getLog(this_00);
      tcu::TestLog::operator<<(&local_1d0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar3 = tcu::MessageBuilder::operator<<(&local_1d0,(char (*) [16])"Invalid texel: ");
      local_1d4 = std::setbase(0x10);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1d4);
      local_1d5 = std::setfill<char>('0');
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1d5);
      local_1dc = std::setw(8);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1dc);
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,
                          (ulong)local_50[0]);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,pvVar2);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [12])0x2b29eab);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_50);
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1d0);
      this_local._7_1_ = false;
      goto LAB_010abed2;
    }
    local_50[0] = local_50[0] + 1;
  } while( true );
}

Assistant:

bool GLSLTestBase::checkResults(Utils::texture& color_texture) const
{
	static const GLuint		 green_color	   = 0xff00ff00;
	const GLuint			 texture_data_size = m_color_texture_width * m_color_texture_height;
	std::vector<glw::GLuint> texture_data;

	texture_data.resize(texture_data_size);

	color_texture.get(m_color_texture_format, m_color_texture_type, &texture_data[0]);

	for (GLuint i = 0; i < texture_data_size; ++i)
	{
		if (green_color != texture_data[i])
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid texel: " << std::setbase(16)
												<< std::setfill('0') << std::setw(8) << texture_data[i]
												<< " at index: " << i << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return verifyAdditionalResults();
}